

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char16_t,_QString>,_char16_t>,_QString>,_char16_t>
::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char16_t,_QString>,_char16_t>,_QString>,_char16_t>
          *this)

{
  long lVar1;
  long lVar2;
  char16_t *pcVar3;
  char16_t *pcVar4;
  
  lVar1 = (this->a).a.a.b.d.size;
  lVar2 = (this->a).b.d.size;
  (__return_storage_ptr__->d).size = -0x5555555555555556;
  (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,lVar1 + 3 + lVar2,Uninitialized);
  pcVar4 = (__return_storage_ptr__->d).ptr;
  *pcVar4 = (this->a).a.a.a;
  pcVar4 = pcVar4 + 1;
  lVar1 = (this->a).a.a.b.d.size;
  if (lVar1 != 0) {
    pcVar3 = (this->a).a.a.b.d.ptr;
    if (pcVar3 == (char16_t *)0x0) {
      pcVar3 = (char16_t *)&QString::_empty;
    }
    memcpy(pcVar4,pcVar3,lVar1 * 2);
  }
  pcVar4 = pcVar4 + lVar1;
  *pcVar4 = (this->a).a.b;
  lVar1 = (this->a).b.d.size;
  if (lVar1 != 0) {
    pcVar3 = (this->a).b.d.ptr;
    if (pcVar3 == (char16_t *)0x0) {
      pcVar3 = (char16_t *)&QString::_empty;
    }
    memcpy(pcVar4 + 1,pcVar3,lVar1 * 2);
  }
  (pcVar4 + 1)[lVar1] = this->b;
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }